

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getshortstr(Table *t,TString *key)

{
  int nx;
  TValue *k;
  Node *n;
  TString *key_local;
  Table *t_local;
  
  for (k = &t->node[(int)(key->hash & (1 << (t->lsizenode & 0x1f)) - 1U)].i_val;
      (k[1].tt_ != 0x44 || ((TString *)k[1].value_.gc != key));
      k = k + (long)*(int *)&k[1].field_0xc * 2) {
    if (*(int *)&k[1].field_0xc == 0) {
      return &luaO_nilobject_;
    }
  }
  return k;
}

Assistant:

const TValue *luaH_getshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tt == LUA_TSHRSTR);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}